

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branch_and_reduce_algorithm.cpp
# Opt level: O3

void __thiscall branch_and_reduce_algorithm::get_stcut_vertices(branch_and_reduce_algorithm *this)

{
  vector<int,_std::allocator<int>_> *partition_index;
  vector<int,std::allocator<int>> *pvVar1;
  pointer piVar2;
  pointer piVar3;
  iterator iVar4;
  int *piVar5;
  undefined1 auVar6 [16];
  pointer ppVar7;
  int iVar8;
  int iVar9;
  pointer pvVar10;
  int *piVar11;
  ulong uVar12;
  pointer pvVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  pointer ppVar17;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  int u;
  int id;
  int v;
  vector<int,_std::allocator<int>_> vc;
  vector<int,_std::allocator<int>_> reverseMapping;
  vector<int,_std::allocator<int>_> U;
  vector<int,_std::allocator<int>_> V;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> edges;
  undefined1 local_1c8 [16];
  pointer local_1b8;
  vector<int,_std::allocator<int>_> mapping;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  biGraph;
  max_flow_algo flow_algo;
  
  piVar2 = (this->cut).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  if ((this->cut).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar2) {
    (this->cut).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  iVar8 = get_max_deg_vtx(this);
  (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [iVar8] = 0;
  iVar9 = get_max_deg_vtx(this);
  (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
  [iVar8] = -1;
  this->s = iVar8;
  this->t = iVar9;
  local_1b8 = (pointer)0x0;
  local_1c8 = (undefined1  [16])0x0;
  edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  max_flow_algo::max_flow_algo(&flow_algo,&this->adj,&this->x);
  auVar6 = _DAT_00124390;
  auVar21 = _DAT_00124380;
  auVar20 = _DAT_00124370;
  partition_index = &this->partition_index;
  piVar2 = (this->partition_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  piVar3 = (this->partition_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (piVar2 != piVar3) {
    uVar12 = (long)piVar3 + (-4 - (long)piVar2);
    auVar23._8_4_ = (int)uVar12;
    auVar23._0_8_ = uVar12;
    auVar23._12_4_ = (int)(uVar12 >> 0x20);
    auVar19._0_8_ = uVar12 >> 2;
    auVar19._8_8_ = auVar23._8_8_ >> 2;
    uVar14 = 0;
    auVar19 = auVar19 ^ _DAT_00124380;
    do {
      auVar22._8_4_ = (int)uVar14;
      auVar22._0_8_ = uVar14;
      auVar22._12_4_ = (int)(uVar14 >> 0x20);
      auVar23 = (auVar22 | auVar20) ^ auVar21;
      iVar8 = auVar19._4_4_;
      if ((bool)(~(auVar23._4_4_ == iVar8 && auVar19._0_4_ < auVar23._0_4_ || iVar8 < auVar23._4_4_)
                & 1)) {
        piVar2[uVar14] = 1;
      }
      if ((auVar23._12_4_ != auVar19._12_4_ || auVar23._8_4_ <= auVar19._8_4_) &&
          auVar23._12_4_ <= auVar19._12_4_) {
        piVar2[uVar14 + 1] = 1;
      }
      auVar23 = (auVar22 | auVar6) ^ auVar21;
      iVar9 = auVar23._4_4_;
      if (iVar9 <= iVar8 && (iVar9 != iVar8 || auVar23._0_4_ <= auVar19._0_4_)) {
        piVar2[uVar14 + 2] = 1;
        piVar2[uVar14 + 3] = 1;
      }
      uVar14 = uVar14 + 4;
    } while (((uVar12 >> 2) + 4 & 0xfffffffffffffffc) != uVar14);
  }
  max_flow_algo::solve_max_flow_min_cut
            (&flow_algo,this->rn,this->s,this->t,true,(vector<int,_std::allocator<int>_> *)local_1c8
             ,true,&edges,partition_index);
  reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::vector
            (&mapping,(long)this->n,(value_type_conflict1 *)&reverseMapping,(allocator_type *)&U);
  reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  biGraph.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  biGraph.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  biGraph.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  id = 0;
  ppVar7 = edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  if (edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start !=
      edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    ppVar17 = edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
              _M_impl.super__Vector_impl_data._M_start;
    do {
      u = ppVar17->first;
      v = ppVar17->second;
      if (mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[u] == -1) {
        mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[u] = id;
        if (reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&reverseMapping,
                     (iterator)
                     reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,&u);
        }
        else {
          *reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish = u;
          reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&U,
                     (iterator)
                     U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                     ._M_finish,&id);
        }
        else {
          *U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
               = id;
          U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
               = U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish + 1;
        }
        vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             (pointer)0x0;
        vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             (pointer)0x0;
        vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
        ::emplace_back<std::vector<int,std::allocator<int>>>
                  ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                    *)&biGraph,&vc);
        if (vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        id = id + 1;
      }
      lVar15 = (long)v;
      if (mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar15] == -1) {
        mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[lVar15] = id;
        if (reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&reverseMapping,
                     (iterator)
                     reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,&v);
        }
        else {
          *reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish = v;
          reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish =
               reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish + 1;
        }
        if (V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&V,
                     (iterator)
                     V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                     ._M_finish,&id);
        }
        else {
          *V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
               = id;
          V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
               = V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_finish + 1;
        }
        vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
             (pointer)0x0;
        vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
             (pointer)0x0;
        vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::
        vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
        ::emplace_back<std::vector<int,std::allocator<int>>>
                  ((vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>
                    *)&biGraph,&vc);
        if (vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        id = id + 1;
        lVar15 = (long)v;
      }
      pvVar1 = (vector<int,std::allocator<int>> *)
               (biGraph.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start +
               mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start[u]);
      iVar4._M_current = *(int **)(pvVar1 + 8);
      if (iVar4._M_current == *(int **)(pvVar1 + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (pvVar1,iVar4,
                   mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar15);
      }
      else {
        *iVar4._M_current =
             mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[lVar15];
        *(int **)(pvVar1 + 8) = iVar4._M_current + 1;
      }
      pvVar1 = (vector<int,std::allocator<int>> *)
               (biGraph.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start +
               mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start[v]);
      iVar4._M_current = *(int **)(pvVar1 + 8);
      if (iVar4._M_current == *(int **)(pvVar1 + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (pvVar1,iVar4,
                   mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + u);
      }
      else {
        *iVar4._M_current =
             mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start[u];
        *(int **)(pvVar1 + 8) = iVar4._M_current + 1;
      }
      ppVar17 = ppVar17 + 1;
    } while (ppVar17 != ppVar7);
  }
  vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_end_of_storage
       = (pointer)0x0;
  hc_karp(&biGraph,&U,&V,&vc);
  if ((long)vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0) {
    lVar15 = (long)vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish -
             (long)vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_start >> 2;
    piVar2 = (partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar16 = 0;
    do {
      iVar8 = reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start
              [vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[lVar16]];
      vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [lVar16] = iVar8;
      piVar2[iVar8] = 2;
      lVar16 = lVar16 + 1;
    } while (lVar15 + (ulong)(lVar15 == 0) != lVar16);
  }
  u = 0;
  pvVar10 = (this->adj).
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pvVar13 = (this->adj).
            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar13 != pvVar10) {
    uVar12 = 0;
    do {
      if (((this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[uVar12] < 0) &&
         ((partition_index->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar12] == 2)) {
        iVar4._M_current =
             (this->cut).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar4._M_current ==
            (this->cut).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->cut,iVar4,&u);
          pvVar10 = (this->adj).
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pvVar13 = (this->adj).
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        }
        else {
          *iVar4._M_current = (int)uVar12;
          (this->cut).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = iVar4._M_current + 1;
        }
      }
      uVar12 = (long)u + 1;
      u = (int)uVar12;
      uVar14 = ((long)pvVar13 - (long)pvVar10 >> 3) * -0x5555555555555555;
    } while (uVar12 <= uVar14 && uVar14 - uVar12 != 0);
  }
  piVar11 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  piVar5 = (this->x).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (piVar11 == piVar5) {
    dVar18 = 0.0;
  }
  else {
    lVar15 = 0;
    do {
      lVar15 = lVar15 + (ulong)(*piVar11 == -1);
      piVar11 = piVar11 + 1;
    } while (piVar11 != piVar5);
    auVar20._8_4_ = (int)((ulong)lVar15 >> 0x20);
    auVar20._0_8_ = lVar15;
    auVar20._12_4_ = 0x45300000;
    dVar18 = (auVar20._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0);
  }
  uVar12 = TUNING_PARAM1;
  if (TUNING_PARAM1 < 0) {
    uVar12 = (ulong)(uint)(int)((double)this->rn * ((double)-TUNING_PARAM1 / 100.0));
  }
  piVar2 = (this->cut).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  piVar3 = (this->cut).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_finish;
  if ((uVar12 & 0xffffffff) < (ulong)((long)piVar3 - (long)piVar2 >> 2)) {
    if (piVar3 == piVar2) goto LAB_00114104;
  }
  else {
    if (piVar3 == piVar2) goto LAB_00114104;
    lVar15 = (long)(local_1c8._8_8_ - local_1c8._0_8_) >> 2;
    auVar21._8_4_ = (int)((long)(local_1c8._8_8_ - local_1c8._0_8_) >> 0x22);
    auVar21._0_8_ = lVar15;
    auVar21._12_4_ = 0x45300000;
    dVar18 = ((auVar21._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)lVar15) - 4503599627370496.0)) / dVar18;
    if (dVar18 <= 1.0 - TUNING_PARAM2 && TUNING_PARAM2 <= dVar18) goto LAB_00114104;
  }
  (this->cut).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = piVar2;
LAB_00114104:
  if (vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                    ._M_start,
                    (long)vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vc.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&biGraph);
  if (V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(V.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)V.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)V.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if (U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start !=
      (pointer)0x0) {
    operator_delete(U.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start,(long)U.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage -
                             (long)U.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start);
  }
  if (reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)reverseMapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      != (pointer)0x0) {
    operator_delete(mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)mapping.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  max_flow_algo::~max_flow_algo(&flow_algo);
  if (edges.super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(edges.
                    super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)edges.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)edges.
                          super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if ((pointer)local_1c8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1c8._0_8_,(long)local_1b8 - local_1c8._0_8_);
  }
  return;
}

Assistant:

void branch_and_reduce_algorithm::get_stcut_vertices()
{
    cut.clear();
    // choose s and t with max deg
    NodeID v1 = get_max_deg_vtx();
    x[v1] = 0;
    NodeID v2 = get_max_deg_vtx();
    x[v1] = -1;

    s = v1;
    t = v2;

    std::vector<int> res = {};
    std::vector<std::pair<int, int>> edges;

    max_flow_algo flow_algo(adj, x);
    std::fill (partition_index.begin(), partition_index.end(), 1);
    int s2 = flow_algo.solve_max_flow_min_cut(rn, s, t, true, res, true, edges, partition_index);

    std::vector<int> mapping(n, -1);
    std::vector<int> reverseMapping;
    std::vector<int> U, V;
    std::vector<std::vector<int>> biGraph;

    int id = 0;
    for (auto edge : edges)
    {
        int u = edge.first;
        int v = edge.second;
        if (mapping[u] == -1)
        {
            mapping[u] = id;
            reverseMapping.push_back(u);
            U.push_back(id);
            biGraph.push_back(std::vector<int>());
            id++;
        }
        if (mapping[v] == -1)
        {
            mapping[v] = id;
            reverseMapping.push_back(v);
            V.push_back(id);
            biGraph.push_back(std::vector<int>());
            id++;
        }

        biGraph[mapping[u]].push_back(mapping[v]);
        biGraph[mapping[v]].push_back(mapping[u]);
    }

    std::vector<int> vc;
    hc_karp(biGraph, U, V, vc);
    for (int i = 0; i < vc.size(); i++)
    {
        vc[i] = reverseMapping[vc[i]];
        partition_index[vc[i]] = 2;
    }

    for (int i = 0; i < adj.size(); ++i)
    {
        if (x[i] < 0 && partition_index[i] == 2)
            cut.push_back(i);
    }

    double perc = (double)res.size() / (double)number_of_nodes_remaining();
    unsigned int max_size = TUNING_PARAM1 >= 0 ? TUNING_PARAM1 : (int)((((double)(-TUNING_PARAM1)) / 100) * (double)rn);
    if (cut.size() > max_size || perc < TUNING_PARAM2 || perc > (1.0 - TUNING_PARAM2))
    {
        // to big, use max. deg. vertex instead
        cut.clear();
    }
}